

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O2

void __thiscall
FSoftwareRenderer::Precache
          (FSoftwareRenderer *this,BYTE *texhitlist,
          TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist)

{
  ushort uVar1;
  int iVar2;
  PClassActor *pPVar3;
  spriteframe_t *psVar4;
  bool bVar5;
  uint uVar6;
  FSoftwareRenderer *this_00;
  uint uVar7;
  long lVar8;
  long lVar9;
  FTexture *tex;
  ulong uVar10;
  Pair *pair;
  Iterator it;
  
  uVar10 = (ulong)sprites.Count;
  this_00 = (FSoftwareRenderer *)operator_new__(uVar10);
  it.Position = 0;
  it.Map = actorhitlist;
  memset(this_00,0,uVar10);
  while (bVar5 = TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
                 ::NextPair(&it,&pair), uVar6 = sprites.Count, bVar5) {
    pPVar3 = pair->Key;
    iVar2 = pPVar3->NumOwnedStates;
    lVar8 = 0x10;
    for (lVar9 = 0; lVar9 < iVar2; lVar9 = lVar9 + 1) {
      *(undefined1 *)
       ((long)&(this_00->super_FRenderer)._vptr_FRenderer +
       (long)*(int *)((long)&pPVar3->OwnedStates->NextState + lVar8)) = 1;
      lVar8 = lVar8 + 0x28;
    }
  }
  while (uVar6 = uVar6 - 1, -1 < (int)uVar6) {
    uVar10 = (ulong)(uVar6 & 0x7fffffff);
    if (*(char *)((long)&(this_00->super_FRenderer)._vptr_FRenderer + uVar10) != '\0') {
      for (uVar7 = 0; psVar4 = SpriteFrames.Array, uVar7 < sprites.Array[uVar10].numframes;
          uVar7 = uVar7 + 1) {
        uVar1 = sprites.Array[uVar10].spriteframes;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          lVar9 = (long)psVar4[uVar1 + uVar7].Texture[lVar8].texnum;
          if (0 < lVar9) {
            texhitlist[lVar9] = '\b';
          }
        }
      }
    }
  }
  operator_delete__(this_00);
  uVar10 = (ulong)TexMan.Textures.Count;
  lVar8 = uVar10 << 4;
  while( true ) {
    uVar10 = uVar10 - 1;
    if ((int)uVar10 + 1 < 1) break;
    if (uVar10 < TexMan.Textures.Count) {
      tex = *(FTexture **)((long)&TexMan.Textures.Array[-1].Texture + lVar8);
    }
    else {
      tex = (FTexture *)0x0;
    }
    PrecacheTexture(this_00,tex,(uint)texhitlist[uVar10]);
    lVar8 = lVar8 + -0x10;
  }
  return;
}

Assistant:

void FSoftwareRenderer::Precache(BYTE *texhitlist, TMap<PClassActor*, bool> &actorhitlist)
{
	BYTE *spritelist = new BYTE[sprites.Size()];
	TMap<PClassActor*, bool>::Iterator it(actorhitlist);
	TMap<PClassActor*, bool>::Pair *pair;

	memset(spritelist, 0, sprites.Size());

	while (it.NextPair(pair))
	{
		PClassActor *cls = pair->Key;

		for (int i = 0; i < cls->NumOwnedStates; i++)
		{
			spritelist[cls->OwnedStates[i].sprite] = true;
		}
	}

	// Precache textures (and sprites).

	for (int i = (int)(sprites.Size() - 1); i >= 0; i--)
	{
		if (spritelist[i])
		{
			int j, k;
			for (j = 0; j < sprites[i].numframes; j++)
			{
				const spriteframe_t *frame = &SpriteFrames[sprites[i].spriteframes + j];

				for (k = 0; k < 16; k++)
				{
					FTextureID pic = frame->Texture[k];
					if (pic.isValid())
					{
						texhitlist[pic.GetIndex()] = FTextureManager::HIT_Sprite;
					}
				}
			}
		}
	}
	delete[] spritelist;

	int cnt = TexMan.NumTextures();
	for (int i = cnt - 1; i >= 0; i--)
	{
		PrecacheTexture(TexMan.ByIndex(i), texhitlist[i]);
	}
}